

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<chaiscript::AST_Node_Trace_const&,void>
          (Boxed_Value *this,AST_Node_Trace *t,bool t_return_value)

{
  AST_Node_Trace local_80;
  byte local_19;
  AST_Node_Trace *pAStack_18;
  bool t_return_value_local;
  AST_Node_Trace *t_local;
  Boxed_Value *this_local;
  
  local_19 = t_return_value;
  pAStack_18 = t;
  t_local = (AST_Node_Trace *)this;
  AST_Node_Trace::AST_Node_Trace(&local_80,t);
  Object_Data::get<chaiscript::AST_Node_Trace>((Object_Data *)this,&local_80,(bool)(local_19 & 1));
  AST_Node_Trace::~AST_Node_Trace(&local_80);
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
        : m_data(Object_Data::get(std::forward<T>(t), t_return_value)) {
    }